

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O1

void __thiscall
duckdb::PartialBlockManager::AllocateBlock
          (PartialBlockManager *this,PartialBlockState *state,uint32_t segment_size)

{
  BlockManager *pBVar1;
  int iVar2;
  uint uVar3;
  block_id_t bVar4;
  undefined4 extraout_var;
  idx_t iVar5;
  idx_t iVar6;
  
  bVar4 = -1;
  if (this->partial_block_type == FULL_CHECKPOINT) {
    iVar2 = (*this->block_manager->_vptr_BlockManager[4])();
    bVar4 = CONCAT44(extraout_var,iVar2);
  }
  state->block_id = bVar4;
  pBVar1 = this->block_manager;
  iVar5 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar6 = optional_idx::GetIndex(&pBVar1->block_header_size);
  uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(iVar5 - iVar6);
  state->block_size = uVar3;
  state->offset = 0;
  state->block_use_count = 1;
  return;
}

Assistant:

void PartialBlockManager::AllocateBlock(PartialBlockState &state, uint32_t segment_size) {
	D_ASSERT(segment_size <= block_manager.GetBlockSize());
	if (partial_block_type == PartialBlockType::FULL_CHECKPOINT) {
		state.block_id = block_manager.GetFreeBlockId();
	} else {
		state.block_id = INVALID_BLOCK;
	}
	state.block_size = NumericCast<uint32_t>(block_manager.GetBlockSize());
	state.offset = 0;
	state.block_use_count = 1;
}